

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_digest.c
# Opt level: O3

void * GostR3411_2012_256_digest_newctx(void *provctx)

{
  GOST_CTX_conflict *pGVar1;
  
  pGVar1 = digest_newctx(provctx,&GostR3411_2012_256_digest,(OSSL_PARAM *)0x0);
  return pGVar1;
}

Assistant:

static GOST_CTX *digest_newctx(void *provctx, GOST_digest *descriptor,
                               const OSSL_PARAM *known_params)
{
    GOST_CTX *gctx = NULL;

    if ((gctx = OPENSSL_zalloc(sizeof(*gctx))) != NULL) {
        gctx->provctx = provctx;
        gctx->known_params = known_params;
        gctx->descriptor = descriptor;
        gctx->digest = GOST_init_digest(descriptor);
        gctx->dctx = EVP_MD_CTX_new();

        if (gctx->digest == NULL || gctx->dctx == NULL) {
            digest_freectx(gctx);
            gctx = NULL;
        }
    }
    return gctx;
}